

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbd.c
# Opt level: O2

PF doscan(KEYMAP *map,int c,KEYMAP **newmap)

{
  PF p_Var1;
  PF *pp_Var2;
  
  ele = map->map_element;
  do {
    if (map->map_element + map->map_num <= ele) {
LAB_001110d6:
      pp_Var2 = &map->map_default;
LAB_001110e7:
      p_Var1 = *pp_Var2;
      if ((newmap != (KEYMAP **)0x0) && (p_Var1 == (PF)0x0)) {
        *newmap = ele->k_prefmap;
      }
      return p_Var1;
    }
    if (c <= ele->k_num) {
      if (ele->k_base <= c) {
        pp_Var2 = ele->k_funcp + (c - ele->k_base);
        goto LAB_001110e7;
      }
      goto LAB_001110d6;
    }
    ele = ele + 1;
  } while( true );
}

Assistant:

PF
doscan(KEYMAP *map, int c, KEYMAP **newmap)
{
	struct map_element	*elec = &map->map_element[0];
	struct map_element	*last = &map->map_element[map->map_num];
	PF		 ret;

	while (elec < last && c > elec->k_num)
		elec++;

	/* used by prefix and binding code */
	ele = elec;
	if (elec >= last || c < elec->k_base)
		ret = map->map_default;
	else
		ret = elec->k_funcp[c - elec->k_base];
	if (ret == NULL && newmap != NULL)
		*newmap = elec->k_prefmap;

	return (ret);
}